

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  WhereMaskSet *pMaskSet;
  u32 *puVar1;
  Bitmask *pBVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  LogEst LVar6;
  undefined2 uVar7;
  u32 uVar8;
  WhereInfo *pWVar9;
  Parse *pParse;
  sqlite3 *db;
  Expr *pIn;
  Parse *pParse_00;
  sqlite3 *psVar10;
  WhereTerm *pWVar11;
  undefined8 *puVar12;
  code *pcVar13;
  Vdbe *pVVar14;
  char cVar15;
  char cVar16;
  byte bVar17;
  ushort uVar18;
  short sVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  Bitmask BVar24;
  Expr *pEVar25;
  WhereOrInfo *pWC_00;
  CollSeq *pCVar26;
  FuncDef *pFVar27;
  sqlite3_value *pVal;
  byte *pbVar28;
  WhereOrInfo *pWC_01;
  WhereTerm *pWVar29;
  undefined8 *puVar30;
  Expr *pEVar31;
  Select *pSVar32;
  ExprList *pEVar33;
  Expr *pEVar34;
  Op *pOVar35;
  size_t sVar36;
  byte bVar37;
  ExprList_item *pEVar38;
  long lVar39;
  byte bVar40;
  ulong uVar41;
  ushort uVar42;
  uint uVar43;
  uint uVar44;
  ulong uVar45;
  char *pcVar46;
  u8 uVar47;
  int i;
  int iVar48;
  ulong uVar49;
  WhereTerm *pWVar50;
  ulong uVar51;
  short sVar52;
  WhereTerm *pWVar53;
  SrcList *pSVar54;
  SrcList *pSVar55;
  SrcList *pSVar56;
  bool bVar57;
  int iVar58;
  long lVar59;
  bool bVar60;
  int aiCurCol [2];
  Token local_60;
  WhereMaskSet *local_50;
  Expr *local_48;
  ulong local_40;
  undefined1 local_38 [8];
  
  pWVar9 = pWC->pWInfo;
  pParse = pWVar9->pParse;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  pWVar29 = pWC->a;
  pMaskSet = &pWVar9->sMaskSet;
  pIn = pWVar29[idxTerm].pExpr;
  if (pIn->pLeft == (Expr *)0x0) {
    uVar23 = 0;
  }
  else {
    uVar23 = sqlite3WhereExprUsageNN(pMaskSet,pIn->pLeft);
  }
  pWVar29 = pWVar29 + idxTerm;
  bVar17 = pIn->op;
  if (bVar17 == 0x32) {
    pWVar29->prereqRight = 0;
  }
  else if (bVar17 == 0x31) {
    iVar20 = sqlite3ExprCheckIN(pParse,pIn);
    if (iVar20 != 0) {
      return;
    }
    if ((pIn->flags & 0x800) == 0) {
      BVar24 = sqlite3WhereExprListUsage(pMaskSet,(pIn->x).pList);
    }
    else {
      BVar24 = exprSelectUsage(pMaskSet,(Select *)(pIn->x).pList);
    }
    pWVar29->prereqRight = BVar24;
  }
  else {
    if (pIn->pRight == (Expr *)0x0) {
      BVar24 = 0;
    }
    else {
      BVar24 = sqlite3WhereExprUsageNN(pMaskSet,pIn->pRight);
    }
    pWVar29->prereqRight = BVar24;
  }
  pMaskSet->bVarSelect = 0;
  BVar24 = sqlite3WhereExprUsageNN(pMaskSet,pIn);
  if (pMaskSet->bVarSelect != 0) {
    pbVar28 = (byte *)((long)&pWVar29->wtFlags + 1);
    *pbVar28 = *pbVar28 | 0x10;
  }
  local_50 = pMaskSet;
  if ((pIn->flags & 1) != 0) {
    uVar49 = (ulong)(pWVar9->sMaskSet).n;
    if (0 < (long)uVar49) {
      uVar45 = 0;
      do {
        if ((pWVar9->sMaskSet).ix[uVar45] == (int)pIn->iRightJoinTable) {
          uVar49 = 1L << ((byte)uVar45 & 0x3f);
          BVar24 = BVar24 | 1L << (uVar45 & 0x3f);
          if (BVar24 >> 1 < uVar49) {
            uVar49 = uVar49 - 1;
            goto LAB_0018819b;
          }
          break;
        }
        uVar45 = uVar45 + 1;
      } while (uVar49 != uVar45);
    }
    sqlite3ErrorMsg(pParse,"ON clause references tables to its right");
    return;
  }
  uVar49 = 0;
LAB_0018819b:
  pWVar29->prereqAll = BVar24;
  pWVar29->iParent = -1;
  pWVar29->leftCursor = -1;
  pWVar29->eOperator = 0;
  uVar43 = (uint)bVar17;
  if ((uVar43 < 0x3a) && ((0x3e6200000000000U >> ((ulong)uVar43 & 0x3f) & 1) != 0)) {
    pEVar25 = pIn->pLeft;
    while (pEVar25 != (Expr *)0x0) {
      if ((pEVar25->flags >> 0xc & 1) == 0) goto LAB_0018823a;
      if ((pEVar25->flags >> 0x12 & 1) == 0) {
        pEVar38 = (ExprList_item *)&pEVar25->pLeft;
      }
      else {
        pEVar38 = ((pEVar25->x).pList)->a;
      }
      pEVar25 = pEVar38->pExpr;
    }
    pEVar25 = (Expr *)0x0;
LAB_0018823a:
    pEVar31 = pIn->pRight;
    if (pEVar31 == (Expr *)0x0) {
      pEVar31 = (Expr *)0x0;
    }
    else {
      do {
        if ((pEVar31->flags >> 0xc & 1) == 0) goto LAB_00188280;
        if ((pEVar31->flags >> 0x12 & 1) == 0) {
          pEVar38 = (ExprList_item *)&pEVar31->pLeft;
        }
        else {
          pEVar38 = ((pEVar31->x).pList)->a;
        }
        pEVar31 = pEVar38->pExpr;
      } while (pEVar31 != (Expr *)0x0);
      pEVar31 = (Expr *)0x0;
    }
LAB_00188280:
    uVar42 = 0x800;
    if ((pWVar29->prereqRight & uVar23) == 0) {
      uVar42 = 0x1fff;
    }
    if (0 < pWVar29->iField) {
      pEVar25 = ((pEVar25->x).pList)->a[pWVar29->iField - 1].pExpr;
    }
    iVar20 = exprMightBeIndexed(pSrc,uVar23,(int *)&local_60,pEVar25,uVar43);
    uVar44 = (uint)bVar17;
    if (iVar20 != 0) {
      pWVar29->leftCursor = (int)local_60.z;
      (pWVar29->u).leftColumn = local_60.z._4_4_;
      if (uVar43 == 0x2d) {
        uVar18 = 0x80;
      }
      else if (uVar44 == 0x31) {
        uVar18 = 1;
      }
      else if (uVar44 == 0x32) {
        uVar18 = 0x100;
      }
      else {
        uVar18 = (ushort)(2 << (bVar17 - 0x35 & 0x1f));
      }
      pWVar29->eOperator = uVar42 & uVar18;
    }
    if (uVar44 == 0x2d) {
      pbVar28 = (byte *)((long)&pWVar29->wtFlags + 1);
      *pbVar28 = *pbVar28 | 8;
    }
    if ((pEVar31 != (Expr *)0x0) &&
       (iVar20 = exprMightBeIndexed(pSrc,pWVar29->prereqRight,(int *)&local_60,pEVar31,uVar44),
       iVar20 != 0)) {
      if (pWVar29->leftCursor < 0) {
        sVar52 = 0;
        pWVar53 = pWVar29;
        pEVar25 = pIn;
      }
      else {
        if (pIn == (Expr *)0x0) {
          if (db->mallocFailed != '\0') {
            return;
          }
          pEVar25 = (Expr *)0x0;
        }
        else {
          pEVar25 = exprDup(db,pIn,0,(u8 **)0x0);
          if (db->mallocFailed != '\0') {
            if (pEVar25 == (Expr *)0x0) {
              return;
            }
            sqlite3ExprDeleteNN(db,pEVar25);
            return;
          }
        }
        iVar20 = whereClauseInsert(pWC,pEVar25,3);
        if (iVar20 == 0) {
          return;
        }
        pWVar53 = pWC->a;
        pWVar29 = pWVar53 + iVar20;
        pWVar53[iVar20].iParent = idxTerm;
        pWVar53[iVar20].truthProb = pWVar53[idxTerm].truthProb;
        pWVar53[idxTerm].nChild = pWVar53[idxTerm].nChild + '\x01';
        if (uVar44 == 0x2d) {
          pbVar28 = (byte *)((long)&pWVar29->wtFlags + 1);
          *pbVar28 = *pbVar28 | 8;
        }
        *(byte *)&pWVar53[idxTerm].wtFlags = (byte)pWVar53[idxTerm].wtFlags | 8;
        pWVar53 = pWVar53 + idxTerm;
        iVar20 = termIsEquivalence(pParse,pEVar25);
        if (iVar20 == 0) {
          sVar52 = 0;
        }
        else {
          pbVar28 = (byte *)((long)&pWVar53->eOperator + 1);
          *pbVar28 = *pbVar28 | 8;
          sVar52 = 0x800;
        }
      }
      pEVar31 = pEVar25->pLeft;
      uVar43 = pEVar25->pRight->flags;
      if (((pEVar31->flags ^ uVar43) >> 8 & 1) == 0) {
        if ((uVar43 >> 8 & 1) == 0) {
          pCVar26 = sqlite3ExprCollSeq(pParse,pEVar31);
          pEVar31 = pEVar25->pLeft;
          if (pCVar26 != (CollSeq *)0x0) {
            pbVar28 = (byte *)((long)&pEVar31->flags + 1);
            *pbVar28 = *pbVar28 | 1;
          }
        }
        else {
          pEVar25->pRight->flags = uVar43 & 0xfffffeff;
        }
      }
      pEVar34 = pEVar25->pRight;
      pEVar25->pRight = pEVar31;
      pEVar25->pLeft = pEVar34;
      if (0x35 < pEVar25->op) {
        pEVar25->op = (pEVar25->op - 0x36 ^ 2) + 0x36;
      }
      pWVar29->leftCursor = (int)local_60.z;
      (pWVar29->u).leftColumn = local_60.z._4_4_;
      pWVar29->prereqRight = uVar23 | uVar49;
      pWVar29->prereqAll = BVar24;
      uVar47 = pEVar25->op;
      if (uVar47 == '-') {
        sVar19 = 0x80;
      }
      else if (uVar47 == '1') {
        sVar19 = 1;
      }
      else if (uVar47 == '2') {
        sVar19 = 0x100;
      }
      else {
        sVar19 = (short)(2 << (uVar47 - 0x35 & 0x1f));
      }
      pWVar29->eOperator = uVar42 & sVar52 + sVar19;
      pWVar29 = pWVar53;
    }
  }
  else {
    if (pIn->op == '+') {
      pWVar9 = pWC->pWInfo;
      pWVar29 = pWC->a;
      pParse_00 = pWVar9->pParse;
      psVar10 = pParse_00->db;
      pEVar25 = pWVar29[idxTerm].pExpr;
      pWC_00 = (WhereOrInfo *)sqlite3DbMallocZero(psVar10,0x230);
      pWVar29[idxTerm].u.pOrInfo = pWC_00;
      if (pWC_00 != (WhereOrInfo *)0x0) {
        *(byte *)&pWVar29[idxTerm].wtFlags = (byte)pWVar29[idxTerm].wtFlags | 0x10;
        pWVar53 = (pWC_00->wc).aStatic;
        memset(pWVar53,0,0x200);
        (pWC_00->wc).pWInfo = pWVar9;
        (pWC_00->wc).hasOr = '\0';
        (pWC_00->wc).pOuter = (WhereClause *)0x0;
        (pWC_00->wc).nTerm = 0;
        (pWC_00->wc).nSlot = 8;
        (pWC_00->wc).a = pWVar53;
        sqlite3WhereSplit((WhereClause *)pWC_00,pEVar25,'+');
        iVar20 = (pWC_00->wc).nTerm;
        if (0 < iVar20) {
          uVar43 = iVar20 + 1;
          do {
            exprAnalyze(pSrc,(WhereClause *)pWC_00,uVar43 - 2);
            uVar43 = uVar43 - 1;
          } while (1 < uVar43);
        }
        if (psVar10->mallocFailed == '\0') {
          iVar20 = (pWC_00->wc).nTerm;
          if (iVar20 < 1) {
            pWC_00->indexable = 0xffffffffffffffff;
            pWVar29[idxTerm].eOperator = 0x200;
            pWC->hasOr = '\x01';
            uVar23 = 0xffffffffffffffff;
LAB_00189353:
            uVar45 = 0;
            bVar60 = false;
            iVar20 = -1;
LAB_00189362:
            iVar48 = (pWC_00->wc).nTerm;
            local_40 = uVar45;
            if (0 < iVar48) {
              pWVar29 = (pWC_00->wc).a;
              do {
                *(byte *)&pWVar29->wtFlags = (byte)pWVar29->wtFlags & 0xbf;
                iVar21 = pWVar29->leftCursor;
                if (iVar21 != iVar20) {
                  lVar59 = (long)(pWVar9->sMaskSet).n;
                  if (0 < lVar59) {
                    lVar39 = 0;
                    do {
                      if ((pWVar9->sMaskSet).ix[lVar39] == iVar21) {
                        uVar45 = 1L << ((byte)lVar39 & 0x3f);
                        goto LAB_001893b8;
                      }
                      lVar39 = lVar39 + 1;
                    } while (lVar59 != lVar39);
                  }
                  uVar45 = 0;
LAB_001893b8:
                  if ((uVar23 & uVar45) != 0) goto LAB_001893d2;
                }
                pWVar29 = pWVar29 + 1;
                bVar57 = iVar48 < 2;
                iVar48 = iVar48 + -1;
                if (bVar57) break;
              } while( true );
            }
            goto LAB_001894af;
          }
          pWVar53 = (pWC_00->wc).a;
          uVar23 = 0xffffffffffffffff;
          uVar45 = 0xffffffffffffffff;
          do {
            if ((pWVar53->eOperator & 0x1ff) == 0) {
              pWC_01 = (WhereOrInfo *)sqlite3DbMallocRawNN(psVar10,0x228);
              if (pWC_01 == (WhereOrInfo *)0x0) {
                uVar23 = 0;
              }
              else {
                (pWVar53->u).pOrInfo = pWC_01;
                *(byte *)&pWVar53->wtFlags = (byte)pWVar53->wtFlags | 0x20;
                pWVar53->eOperator = 0x400;
                pWVar50 = (pWC_01->wc).aStatic;
                memset(pWVar50,0,0x200);
                (pWC_01->wc).pWInfo = pWC->pWInfo;
                (pWC_01->wc).hasOr = '\0';
                (pWC_01->wc).pOuter = (WhereClause *)0x0;
                (pWC_01->wc).nTerm = 0;
                (pWC_01->wc).nSlot = 8;
                (pWC_01->wc).a = pWVar50;
                sqlite3WhereSplit((WhereClause *)pWC_01,pWVar53->pExpr,',');
                iVar48 = (pWC_01->wc).nTerm;
                if (0 < iVar48) {
                  uVar43 = iVar48 + 1;
                  do {
                    exprAnalyze(pSrc,(WhereClause *)pWC_01,uVar43 - 2);
                    uVar43 = uVar43 - 1;
                  } while (1 < uVar43);
                }
                (pWC_01->wc).pOuter = pWC;
                if (psVar10->mallocFailed == '\0') {
                  iVar48 = (pWC_01->wc).nTerm;
                  if (iVar48 < 1) {
                    uVar23 = 0;
                  }
                  else {
                    pWVar50 = (pWC_01->wc).a;
                    iVar21 = 0;
                    uVar23 = 0;
                    do {
                      uVar41 = (ulong)pWVar50->pExpr->op;
                      if (((uVar41 < 0x3a) && ((0x3e6200000000000U >> (uVar41 & 0x3f) & 1) != 0)) ||
                         (pWVar50->eOperator == 0x40)) {
                        lVar59 = (long)(pWVar9->sMaskSet).n;
                        if (0 < lVar59) {
                          lVar39 = 0;
                          do {
                            if ((pWVar9->sMaskSet).ix[lVar39] == pWVar50->leftCursor) {
                              uVar41 = 1L << ((byte)lVar39 & 0x3f);
                              goto LAB_00188b22;
                            }
                            lVar39 = lVar39 + 1;
                          } while (lVar59 != lVar39);
                        }
                        uVar41 = 0;
LAB_00188b22:
                        uVar23 = uVar23 | uVar41;
                      }
                      iVar21 = iVar21 + 1;
                      pWVar50 = pWVar50 + 1;
                    } while (iVar21 != iVar48);
                  }
                }
                else {
                  uVar23 = 0;
                }
                uVar45 = uVar45 & uVar23;
                uVar23 = 0;
              }
            }
            else {
              uVar42 = pWVar53->wtFlags;
              if ((uVar42 & 8) == 0) {
                lVar59 = (long)(pWVar9->sMaskSet).n;
                if (lVar59 < 1) {
                  uVar41 = 0;
                  uVar51 = 0;
                  if ((uVar42 & 2) != 0) goto LAB_00188b45;
                }
                else {
                  lVar39 = 0;
                  do {
                    if ((pWVar9->sMaskSet).ix[lVar39] == pWVar53->leftCursor) {
                      uVar41 = 1L << ((byte)lVar39 & 0x3f);
                      goto LAB_00188a7c;
                    }
                    lVar39 = lVar39 + 1;
                  } while (lVar59 != lVar39);
                  uVar41 = 0;
LAB_00188a7c:
                  if ((uVar42 & 2) != 0) {
                    lVar39 = 0;
                    do {
                      if ((pWVar9->sMaskSet).ix[lVar39] ==
                          (pWC_00->wc).a[pWVar53->iParent].leftCursor) {
                        uVar51 = 1L << ((byte)lVar39 & 0x3f);
                        goto LAB_00188b45;
                      }
                      lVar39 = lVar39 + 1;
                    } while (lVar59 != lVar39);
                    uVar51 = 0;
LAB_00188b45:
                    uVar41 = uVar41 | uVar51;
                  }
                }
                uVar45 = uVar45 & uVar41;
                uVar23 = uVar23 & uVar41;
                if ((pWVar53->eOperator & 2) == 0) {
                  uVar23 = 0;
                }
              }
            }
            if (iVar20 < 2) break;
            iVar20 = iVar20 + -1;
            pWVar53 = pWVar53 + 1;
          } while (uVar45 != 0);
          pWC_00->indexable = uVar45;
          if (uVar45 == 0) {
            pWVar29[idxTerm].eOperator = 0x200;
          }
          else {
            iVar20 = (pWC_00->wc).nTerm;
            pWVar29[idxTerm].eOperator = 0x200;
            pWC->hasOr = '\x01';
            if (iVar20 == 2) {
              pWVar29 = (pWC_00->wc).a;
              lVar59 = 0;
LAB_00188bb8:
              if (pWVar29->eOperator == 0x400) {
                if (((((pWVar29->u).pOrInfo)->wc).nTerm <= lVar59) ||
                   (pWVar53 = (((pWVar29->u).pOrInfo)->wc).a, pWVar53 == (WhereTerm *)0x0))
                goto LAB_00189345;
                pWVar53 = pWVar53 + lVar59;
              }
              else {
                pWVar53 = pWVar29;
                if (lVar59 != 0) goto LAB_00189345;
              }
              lVar59 = lVar59 + 1;
              lVar39 = 0;
              do {
                if (pWVar29[1].eOperator == 0x400) {
                  if ((((pWVar29[1].u.pOrInfo)->wc).nTerm <= lVar39) ||
                     (pWVar11 = ((pWVar29[1].u.pOrInfo)->wc).a, pWVar50 = pWVar11 + lVar39,
                     pWVar11 == (WhereTerm *)0x0)) goto LAB_00188bb8;
                }
                else {
                  pWVar50 = pWVar29 + 1;
                  if (lVar39 != 0) goto LAB_00188bb8;
                }
                if ((((pWVar53->eOperator & 0x3e) != 0) &&
                    ((((pWVar50->eOperator & 0x3e) != 0 &&
                      (uVar42 = pWVar50->eOperator | pWVar53->eOperator,
                      (uVar42 & 0xffe5) == 0 || (uVar42 & 0xffd9) == 0)) &&
                     (iVar20 = sqlite3ExprCompare((Parse *)0x0,pWVar53->pExpr->pLeft,
                                                  pWVar50->pExpr->pLeft,-1), iVar20 == 0)))) &&
                   (iVar20 = sqlite3ExprCompare((Parse *)0x0,pWVar53->pExpr->pRight,
                                                pWVar50->pExpr->pRight,-1), iVar20 == 0)) {
                  uVar18 = 8;
                  if ((uVar42 & 0x18) == 0) {
                    uVar18 = 0x20;
                  }
                  if ((uVar42 + 0x3f & uVar42) != 0) {
                    uVar42 = uVar18;
                  }
                  if ((pWVar53->pExpr != (Expr *)0x0) &&
                     (pEVar31 = exprDup(pWC->pWInfo->pParse->db,pWVar53->pExpr,0,(u8 **)0x0),
                     pEVar31 != (Expr *)0x0)) {
                    bVar17 = 0;
                    do {
                      bVar37 = bVar17;
                      bVar17 = bVar37 + 1;
                    } while (2 << (bVar37 & 0x1f) != (uint)uVar42);
                    pEVar31->op = bVar37 + 0x35;
                    iVar20 = whereClauseInsert(pWC,pEVar31,3);
                    exprAnalyze(pSrc,pWC,iVar20);
                  }
                }
                lVar39 = lVar39 + 1;
                pWVar29 = (pWC_00->wc).a;
              } while( true );
            }
          }
LAB_00189345:
          if (uVar23 != 0) goto LAB_00189353;
        }
      }
      goto LAB_0018868e;
    }
    if ((pIn->op == '0') && (pWC->op == ',')) {
      pEVar33 = (pIn->x).pList;
      lVar59 = 0;
      bVar60 = true;
      do {
        bVar57 = bVar60;
        bVar17 = "97"[lVar59];
        if (pIn->pLeft == (Expr *)0x0) {
          pEVar25 = (Expr *)0x0;
        }
        else {
          pEVar25 = exprDup(db,pIn->pLeft,0,(u8 **)0x0);
        }
        pEVar31 = pEVar33->a[lVar59].pExpr;
        if (pEVar31 == (Expr *)0x0) {
          pEVar31 = (Expr *)0x0;
        }
        else {
          pEVar31 = exprDup(db,pEVar31,0,(u8 **)0x0);
        }
        pEVar25 = sqlite3PExpr(pParse,(uint)bVar17,pEVar25,pEVar31);
        if (pEVar25 != (Expr *)0x0) {
          pEVar25->flags = pEVar25->flags | pIn->flags & 1;
          pEVar25->iRightJoinTable = pIn->iRightJoinTable;
        }
        iVar20 = whereClauseInsert(pWC,pEVar25,3);
        exprAnalyze(pSrc,pWC,iVar20);
        pWVar29 = pWC->a;
        pWVar29[iVar20].iParent = idxTerm;
        pWVar29[iVar20].truthProb = pWVar29[idxTerm].truthProb;
        pWVar29[idxTerm].nChild = pWVar29[idxTerm].nChild + '\x01';
        lVar59 = 1;
        bVar60 = false;
      } while (bVar57);
      pWVar29 = pWVar29 + idxTerm;
    }
  }
LAB_0018877e:
  if (pWC->op != ',') goto LAB_00189241;
  if ((pIn->op == 0xa1) && ((pIn->x).pList != (ExprList *)0x0)) {
    psVar10 = pParse->db;
    iVar20 = ((pIn->x).pList)->nExpr;
    pFVar27 = sqlite3FindFunction(psVar10,(pIn->u).zToken,iVar20,'\x01','\0');
    if ((pFVar27 != (FuncDef *)0x0) && (uVar43 = pFVar27->funcFlags, (uVar43 & 4) != 0)) {
      pEVar33 = (pIn->x).pList;
      if (iVar20 < 3) {
        bVar17 = 0;
LAB_001887f7:
        pbVar28 = (byte *)pFVar27->pUserData;
        pEVar25 = pEVar33->a[0].pExpr;
        uVar8 = pEVar25->flags;
        while ((uVar8 >> 0xc & 1) != 0) {
          if ((uVar8 >> 0x12 & 1) == 0) {
            pEVar38 = (ExprList_item *)&pEVar25->pLeft;
          }
          else {
            pEVar38 = ((pEVar25->x).pList)->a;
          }
          pEVar25 = pEVar38->pExpr;
          uVar8 = pEVar25->flags;
        }
        bVar37 = *pbVar28;
        bVar3 = pbVar28[1];
        bVar4 = pbVar28[2];
        pEVar31 = *(Expr **)(pEVar33 + 1);
        uVar47 = pEVar25->op;
        if (uVar47 == 0x94) {
          if ((psVar10->flags & 0x800000) != 0) goto LAB_00188900;
          sVar52 = pEVar25->iColumn;
          pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar52,(u8)pEVar31);
          if ((pVal == (sqlite3_value *)0x0) || ((pVal->flags & 0xf) != 2)) {
            pbVar28 = (byte *)0x0;
          }
          else {
            pbVar28 = (byte *)sqlite3ValueText(pVal,'\x01');
          }
          uVar44 = 0x80000000;
          if (sVar52 < 0x20) {
            uVar44 = 1 << ((char)sVar52 - 1U & 0x1f);
          }
          puVar1 = &pParse->pVdbe->expmask;
          *puVar1 = *puVar1 | uVar44;
LAB_00188d95:
          if ((((pbVar28 != (byte *)0x0) && (bVar5 = *pbVar28, bVar5 != 0)) && (bVar5 != bVar37)) &&
             ((bVar5 != bVar3 && (bVar5 != bVar4)))) {
            iVar20 = 0;
            bVar40 = bVar5;
            do {
              uVar23 = (long)iVar20 + 1;
              if ((bVar40 == bVar17) && (pbVar28[uVar23] != 0)) {
                uVar23 = (ulong)(iVar20 + 2);
              }
              iVar20 = (int)uVar23;
              bVar40 = pbVar28[iVar20];
            } while ((((bVar40 != 0) && (bVar40 != bVar37)) && (bVar40 != bVar3)) &&
                    (bVar40 != bVar4));
            if (((iVar20 != 0) && (pbVar28[(long)iVar20 + -1] != 0xff)) &&
               ((1 < iVar20 || (bVar5 != bVar17)))) {
              bVar60 = false;
              if (bVar40 == bVar37) {
                bVar60 = pbVar28[(long)iVar20 + 1] == 0;
              }
              pEVar34 = sqlite3Expr(psVar10,0x6e,(char *)pbVar28);
              if (pEVar34 != (Expr *)0x0) {
                pbVar28 = (byte *)(pEVar34->u).zToken;
                pbVar28[iVar20] = 0;
                if (iVar20 < 1) {
                  uVar23 = 0;
                }
                else {
                  uVar23 = 0;
                  iVar48 = 0;
                  do {
                    bVar37 = pbVar28[iVar48];
                    pbVar28[uVar23] =
                         pbVar28[(int)(iVar48 + (uint)((int)(char)bVar37 == (uint)bVar17))];
                    uVar23 = uVar23 + 1;
                    iVar48 = iVar48 + (uint)((int)(char)bVar37 == (uint)bVar17) + 1;
                  } while (iVar48 < iVar20);
                }
                pbVar28[uVar23 & 0xffffffff] = 0;
                bVar17 = *pbVar28;
                if ((((ulong)bVar17 - 0x30 < 10 || (ulong)bVar17 == 0x2d) ||
                    ((int)uVar23 == 1 && bVar17 == 0x2f)) &&
                   ((pEVar31->op != 0xa2 ||
                    ((cVar16 = sqlite3ExprAffinity(pEVar31), cVar16 != 'B' ||
                     (((pEVar31->y).pTab)->nModuleArg != 0)))))) {
                  sqlite3ExprDeleteNN(psVar10,pEVar34);
                  sqlite3ValueFree(pVal);
                  goto LAB_00188e2e;
                }
              }
              if (uVar47 == 0x94) {
                pVVar14 = pParse->pVdbe;
                uVar7 = pEVar25->iColumn;
                uVar44 = 0x80000000;
                if ((short)uVar7 < 0x20) {
                  uVar44 = 1 << ((char)uVar7 - 1U & 0x1f);
                }
                pVVar14->expmask = pVVar14->expmask | uVar44;
                if ((bVar60) && ((pEVar25->u).zToken[1] != '\0')) {
                  if (pParse->nTempReg == '\0') {
                    iVar20 = pParse->nMem + 1;
                    pParse->nMem = iVar20;
                  }
                  else {
                    bVar17 = pParse->nTempReg - 1;
                    pParse->nTempReg = bVar17;
                    iVar20 = pParse->aTempReg[bVar17];
                  }
                  sqlite3ExprCodeTarget(pParse,pEVar25,iVar20);
                  if (pVVar14->db->mallocFailed == '\0') {
                    pOVar35 = pVVar14->aOp + (long)pVVar14->nOp + -1;
                  }
                  else {
                    pOVar35 = (Op *)&sqlite3VdbeGetOp_dummy;
                  }
                  pOVar35->p3 = 0;
                  if (iVar20 != 0) {
                    bVar17 = pParse->nTempReg;
                    if ((ulong)bVar17 < 8) {
                      pParse->nTempReg = bVar17 + 1;
                      pParse->aTempReg[bVar17] = iVar20;
                    }
                  }
                }
              }
              sqlite3ValueFree(pVal);
              pSVar56 = ((pIn->x).pSelect)->pSrc;
              if (pEVar34 == (Expr *)0x0) {
                pEVar25 = (Expr *)0x0;
              }
              else {
                pEVar25 = exprDup(db,pEVar34,0,(u8 **)0x0);
              }
              if (((uVar43 & 8) == 0) && (pParse->db->mallocFailed == '\0')) {
                pbVar28 = (byte *)((long)&pWVar29->wtFlags + 1);
                *pbVar28 = *pbVar28 | 4;
                pbVar28 = (byte *)(pEVar34->u).zToken;
                bVar17 = *pbVar28;
                if (bVar17 != 0) {
                  lVar59 = 1;
                  do {
                    *pbVar28 = bVar17 & (~""[bVar17] | 0xdf);
                    (pEVar25->u).zToken[lVar59 + -1] = ""[bVar17];
                    bVar17 = (pEVar34->u).zToken[lVar59];
                    pbVar28 = (byte *)((pEVar34->u).zToken + lVar59);
                    lVar59 = lVar59 + 1;
                  } while (bVar17 != 0);
                }
              }
              if (db->mallocFailed == '\0') {
                pcVar46 = (pEVar25->u).zToken;
                if (pcVar46 == (char *)0x0) {
                  uVar23 = 0;
                }
                else {
                  sVar36 = strlen(pcVar46);
                  uVar23 = (ulong)((uint)sVar36 & 0x3fffffff);
                }
                bVar17 = pcVar46[uVar23 - 1];
                if ((uVar43 & 8) == 0) {
                  if (bVar17 == 0x40) {
                    bVar60 = false;
                  }
                  bVar17 = ""[bVar17];
                }
                pcVar46[uVar23 - 1] = bVar17 + 1;
              }
              pcVar46 = "BINARY";
              if ((uVar43 & 8) == 0) {
                pcVar46 = "NOCASE";
              }
              if (pSVar56 == (SrcList *)0x0) {
                pEVar31 = (Expr *)0x0;
              }
              else {
                pEVar31 = exprDup(db,(Expr *)pSVar56,0,(u8 **)0x0);
              }
              local_60.n = 6;
              local_60.z = pcVar46;
              pEVar31 = sqlite3ExprAddCollateToken(pParse,pEVar31,&local_60,0);
              pEVar31 = sqlite3PExpr(pParse,0x39,pEVar31,pEVar34);
              if (pEVar31 != (Expr *)0x0) {
                pEVar31->flags = pEVar31->flags | pIn->flags & 1;
                pEVar31->iRightJoinTable = pIn->iRightJoinTable;
              }
              iVar20 = whereClauseInsert(pWC,pEVar31,0x103);
              exprAnalyze(pSrc,pWC,iVar20);
              if (pSVar56 == (SrcList *)0x0) {
                pEVar31 = (Expr *)0x0;
              }
              else {
                pEVar31 = exprDup(db,(Expr *)pSVar56,0,(u8 **)0x0);
              }
              local_60.n = 6;
              local_60.z = pcVar46;
              pEVar31 = sqlite3ExprAddCollateToken(pParse,pEVar31,&local_60,0);
              pEVar25 = sqlite3PExpr(pParse,0x38,pEVar31,pEVar25);
              if (pEVar25 != (Expr *)0x0) {
                pEVar25->flags = pEVar25->flags | pIn->flags & 1;
                pEVar25->iRightJoinTable = pIn->iRightJoinTable;
              }
              iVar48 = whereClauseInsert(pWC,pEVar25,0x103);
              exprAnalyze(pSrc,pWC,iVar48);
              pWVar53 = pWC->a;
              pWVar29 = pWVar53 + idxTerm;
              if (bVar60) {
                pWVar53[iVar20].iParent = idxTerm;
                LVar6 = pWVar53[idxTerm].truthProb;
                pWVar53[iVar20].truthProb = LVar6;
                uVar47 = pWVar53[idxTerm].nChild;
                pWVar53[iVar48].iParent = idxTerm;
                pWVar53[iVar48].truthProb = LVar6;
                pWVar53[idxTerm].nChild = uVar47 + '\x02';
              }
              goto LAB_00188e2e;
            }
          }
        }
        else {
          if (uVar47 == 'n') {
            pbVar28 = (byte *)(pEVar25->u).zToken;
            pVal = (sqlite3_value *)0x0;
            goto LAB_00188d95;
          }
LAB_00188900:
          pVal = (sqlite3_value *)0x0;
        }
        sqlite3ValueFree(pVal);
      }
      else {
        pcVar46 = *(char **)&pEVar33[1].a[0].sortOrder;
        if (*pcVar46 == 'n') {
          pbVar28 = *(byte **)(pcVar46 + 8);
          bVar17 = *pbVar28;
          if ((bVar17 != 0) && (pbVar28[1] == 0)) goto LAB_001887f7;
        }
      }
    }
  }
LAB_00188e2e:
  if (pWC->op != ',') goto LAB_00189241;
  bVar17 = pIn->op;
  uVar43 = (uint)bVar17;
  if ((uVar43 - 0x33 < 2) || (uVar43 == 0xa0)) {
    pSVar54 = (SrcList *)pIn->pLeft;
    pSVar56 = (SrcList *)pIn->pRight;
    uVar44 = 0;
    if ((char)pSVar54->nSrc == -0x5e) {
      uVar44 = (uint)(*(int *)(*(long *)&pSVar54->a[0].regResult + 0x54) != 0);
    }
    pSVar55 = pSVar54;
    if (pSVar56 == (SrcList *)0x0) {
      pSVar56 = (SrcList *)0x0;
    }
    else if (((char)pSVar56->nSrc == -0x5e) &&
            (*(int *)(*(long *)&pSVar56->a[0].regResult + 0x54) != 0)) {
      uVar44 = uVar44 + 1;
      pSVar55 = pSVar56;
      pSVar56 = pSVar54;
    }
    if (uVar43 == 0xa0) {
      uVar47 = 'E';
    }
    else if (uVar43 == 0x34) {
      uVar47 = 'D';
    }
    else if (uVar43 == 0x33) {
      uVar47 = 'F';
    }
    else {
      uVar47 = '\0';
    }
    if (uVar44 != 0) {
LAB_00188fab:
      uVar44 = uVar44 + 1;
      do {
        pSVar54 = pSVar55;
        if (pSVar56 == (SrcList *)0x0) {
          BVar24 = 0;
        }
        else {
          BVar24 = sqlite3WhereExprUsageNN(local_50,(Expr *)pSVar56);
        }
        if (pSVar54 == (SrcList *)0x0) {
          uVar23 = 0;
        }
        else {
          uVar23 = sqlite3WhereExprUsageNN(local_50,(Expr *)pSVar54);
        }
        if ((uVar23 & BVar24) == 0) {
          if (pSVar56 == (SrcList *)0x0) {
            pEVar25 = (Expr *)0x0;
          }
          else {
            pEVar25 = exprDup(db,(Expr *)pSVar56,0,(u8 **)0x0);
          }
          pEVar25 = sqlite3PExpr(pParse,0x2e,(Expr *)0x0,pEVar25);
          if (((pIn->flags & 1) != 0) && (pEVar25 != (Expr *)0x0)) {
            *(byte *)&pEVar25->flags = (byte)pEVar25->flags | 1;
          }
          iVar20 = whereClauseInsert(pWC,pEVar25,3);
          pWVar53 = pWC->a;
          pWVar53[iVar20].prereqRight = BVar24;
          pWVar53[iVar20].leftCursor = *(int *)((long)&pSVar54->a[0].pTab + 4);
          *(int *)&pWVar53[iVar20].u = (int)*(short *)&pSVar54->a[0].pSelect;
          pWVar53[iVar20].eOperator = 0x40;
          pWVar53[iVar20].eMatchOp = uVar47;
          pWVar50 = pWC->a;
          pWVar50[iVar20].iParent = idxTerm;
          pWVar50[iVar20].truthProb = pWVar50[idxTerm].truthProb;
          pWVar50[idxTerm].nChild = pWVar50[idxTerm].nChild + '\x01';
          *(byte *)&pWVar50[idxTerm].wtFlags = (byte)pWVar50[idxTerm].wtFlags | 8;
          pWVar29 = pWVar50 + idxTerm;
          pWVar53[iVar20].prereqAll = pWVar50[idxTerm].prereqAll;
        }
        uVar44 = uVar44 - 1;
        pSVar55 = pSVar56;
        pSVar56 = pSVar54;
      } while (1 < uVar44);
    }
LAB_001890be:
    if (pWC->op != ',') goto LAB_00189241;
    bVar17 = pIn->op;
  }
  else if (uVar43 == 0xa1) {
    pSVar32 = (pIn->x).pSelect;
    if ((pSVar32 != (Select *)0x0) && (*(int *)&pSVar32->pEList == 2)) {
      pSVar55 = pSVar32->pSrc;
      if (((char)pSVar55->nSrc == -0x5e) &&
         (*(int *)(*(long *)&pSVar55->a[0].regResult + 0x54) != 0)) {
        pcVar46 = (pIn->u).zToken;
        lVar59 = 0;
        do {
          iVar20 = sqlite3StrICmp(pcVar46,*(char **)((long)&isAuxiliaryVtabOperator_aOp + lVar59));
          if (iVar20 == 0) {
            uVar47 = (&DAT_001d6798)[lVar59];
            pSVar56 = *(SrcList **)&pSVar32->op;
            goto LAB_00189326;
          }
          lVar59 = lVar59 + 0x10;
        } while (lVar59 != 0x40);
      }
      pSVar55 = *(SrcList **)&pSVar32->op;
      if (((char)pSVar55->nSrc == -0x5e) &&
         (lVar59 = *(long *)&pSVar55->a[0].regResult, *(int *)(lVar59 + 0x54) != 0)) {
        puVar30 = (undefined8 *)(lVar59 + 0x60);
        do {
          puVar12 = (undefined8 *)*puVar30;
          puVar30 = puVar12 + 5;
        } while ((sqlite3 *)*puVar12 != db);
        pcVar13 = *(code **)(*(long *)puVar12[2] + 0x90);
        if ((pcVar13 != (code *)0x0) &&
           (iVar20 = (*pcVar13)((long *)puVar12[2],2,(pIn->u).zToken,&local_60,local_38),
           0x95 < iVar20)) {
          uVar47 = (u8)iVar20;
          pSVar56 = pSVar32->pSrc;
LAB_00189326:
          uVar44 = 1;
          goto LAB_00188fab;
        }
      }
    }
    goto LAB_001890be;
  }
  if ((bVar17 == 0x35) || (bVar17 == 0x2d)) {
    pEVar25 = pIn->pLeft;
    uVar47 = pEVar25->op;
    if (uVar47 == 0xa8) {
      uVar47 = pEVar25->op2;
    }
    if (uVar47 == 0x83) {
      pSVar32 = (pEVar25->x).pSelect;
LAB_0018911b:
      iVar20 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar32->pEList)->pList->nExpr;
      if (1 < iVar20) {
        pEVar31 = pIn->pRight;
        uVar47 = pEVar31->op;
        if (uVar47 == 0xa8) {
          uVar47 = pEVar31->op2;
        }
        if (uVar47 == 0x83) {
          pSVar32 = (pEVar31->x).pSelect;
LAB_00189156:
          iVar48 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar32->pEList)->pList->nExpr;
        }
        else {
          iVar48 = 1;
          if (uVar47 == 0xa9) {
            pSVar32 = (Select *)&pEVar31->x;
            goto LAB_00189156;
          }
        }
        if ((iVar48 == iVar20) &&
           (((pEVar25->flags & 0x800) == 0 || ((pEVar31->flags & 0x800) == 0)))) {
          iVar48 = 0;
          do {
            pEVar25 = sqlite3ExprForVectorField(pParse,pIn->pLeft,iVar48);
            pEVar31 = sqlite3ExprForVectorField(pParse,pIn->pRight,iVar48);
            pEVar25 = sqlite3PExpr(pParse,(uint)pIn->op,pEVar25,pEVar31);
            if (pEVar25 != (Expr *)0x0) {
              pEVar25->flags = pEVar25->flags | pIn->flags & 1;
              pEVar25->iRightJoinTable = pIn->iRightJoinTable;
            }
            iVar21 = whereClauseInsert(pWC,pEVar25,1);
            exprAnalyze(pSrc,pWC,iVar21);
            iVar48 = iVar48 + 1;
          } while (iVar20 != iVar48);
          uVar47 = pWC->op;
          pWVar29 = pWC->a;
          pWVar29[idxTerm].wtFlags = pWVar29[idxTerm].wtFlags | 6;
          pWVar29[idxTerm].eOperator = 0;
          if (uVar47 != ',') goto LAB_00189241;
          pWVar29 = pWVar29 + idxTerm;
        }
      }
    }
    else if (uVar47 == 0xa9) {
      pSVar32 = (Select *)&pEVar25->x;
      goto LAB_0018911b;
    }
    bVar17 = pIn->op;
  }
  if ((((bVar17 == 0x31) && (pWVar29->iField == 0)) && (pEVar25 = pIn->pLeft, pEVar25->op == 0xa9))
     && (((pIn->x).pSelect)->pPrior == (Select *)0x0)) {
    uVar47 = 0xa9;
    iVar20 = 1;
    do {
      if (uVar47 == 0xa8) {
        uVar47 = pEVar25->op2;
      }
      if (uVar47 == 0x83) {
        pSVar32 = (pEVar25->x).pSelect;
LAB_00189286:
        iVar48 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar32->pEList)->pList->nExpr;
      }
      else {
        iVar48 = 1;
        if (uVar47 == 0xa9) {
          pSVar32 = (Select *)&pEVar25->x;
          goto LAB_00189286;
        }
      }
      if (iVar48 <= iVar20 + -1) break;
      iVar48 = whereClauseInsert(pWC,pIn,2);
      pWC->a[iVar48].iField = iVar20;
      exprAnalyze(pSrc,pWC,iVar48);
      pWVar29 = pWC->a;
      pWVar29[iVar48].iParent = idxTerm;
      pWVar29[iVar48].truthProb = pWVar29[idxTerm].truthProb;
      pWVar29[idxTerm].nChild = pWVar29[idxTerm].nChild + '\x01';
      pEVar25 = pIn->pLeft;
      uVar47 = pEVar25->op;
      iVar20 = iVar20 + 1;
    } while( true );
  }
LAB_00189241:
  pBVar2 = &pWC->a[idxTerm].prereqRight;
  *pBVar2 = *pBVar2 | uVar49;
  return;
LAB_001893d2:
  if (0 < iVar48) {
    iVar20 = (pWVar29->u).leftColumn;
    local_48 = pWVar29->pExpr->pLeft;
    iVar58 = 0;
    do {
      if (pWVar29->leftCursor == iVar21) {
        if ((pWVar29->u).leftColumn != iVar20) {
          bVar60 = false;
          goto LAB_0018947b;
        }
        bVar60 = false;
        pEVar31 = pWVar29->pExpr;
        if (iVar20 == -2) {
          iVar22 = sqlite3ExprCompare(pParse_00,pEVar31->pLeft,local_48,-1);
          if (iVar22 != 0) goto LAB_0018947b;
          pEVar31 = pWVar29->pExpr;
        }
        cVar16 = sqlite3ExprAffinity(pEVar31->pRight);
        cVar15 = sqlite3ExprAffinity(pWVar29->pExpr->pLeft);
        if ((cVar16 != '\0') && (cVar16 != cVar15)) goto LAB_0018947b;
        *(byte *)&pWVar29->wtFlags = (byte)pWVar29->wtFlags | 0x40;
      }
      else {
        *(byte *)&pWVar29->wtFlags = (byte)pWVar29->wtFlags & 0xbf;
      }
      pWVar29 = pWVar29 + 1;
      iVar58 = iVar58 + 1;
    } while (iVar48 != iVar58);
  }
  bVar60 = true;
LAB_0018947b:
  uVar45 = (ulong)((int)local_40 + 1);
  iVar20 = iVar21;
  if ((int)local_40 != 0 || bVar60) goto LAB_001894af;
  goto LAB_00189362;
LAB_001894af:
  if (bVar60) {
    iVar20 = (pWC_00->wc).nTerm;
    if (iVar20 < 1) {
      pEVar33 = (ExprList *)0x0;
      pEVar31 = sqlite3PExpr(pParse_00,0x31,(Expr *)0x0,(Expr *)0x0);
      if (pEVar31 != (Expr *)0x0) goto LAB_00189579;
    }
    else {
      pWVar29 = (pWC_00->wc).a;
      uVar43 = iVar20 + 1;
      pEVar31 = (Expr *)0x0;
      pEVar33 = (ExprList *)0x0;
      do {
        if ((pWVar29->wtFlags & 0x40) != 0) {
          pEVar31 = pWVar29->pExpr->pRight;
          if (pEVar31 == (Expr *)0x0) {
            pEVar31 = (Expr *)0x0;
          }
          else {
            pEVar31 = exprDup(psVar10,pEVar31,0,(u8 **)0x0);
          }
          pEVar33 = sqlite3ExprListAppend((Parse *)pWVar9->pParse->db,pEVar33,pEVar31);
          pEVar31 = pWVar29->pExpr->pLeft;
        }
        pWVar29 = pWVar29 + 1;
        uVar43 = uVar43 - 1;
      } while (1 < uVar43);
      if (pEVar31 == (Expr *)0x0) {
        pEVar31 = (Expr *)0x0;
      }
      else {
        pEVar31 = exprDup(psVar10,pEVar31,0,(u8 **)0x0);
      }
      pEVar31 = sqlite3PExpr(pParse_00,0x31,pEVar31,(Expr *)0x0);
      if (pEVar31 == (Expr *)0x0) {
        if (pEVar33 != (ExprList *)0x0) {
          exprListDeleteNN(psVar10,pEVar33);
        }
      }
      else {
LAB_00189579:
        pEVar31->flags = pEVar31->flags | pEVar25->flags & 1;
        pEVar31->iRightJoinTable = pEVar25->iRightJoinTable;
        (pEVar31->x).pList = pEVar33;
        iVar20 = whereClauseInsert(pWC,pEVar31,3);
        exprAnalyze(pSrc,pWC,iVar20);
        pWVar29 = pWC->a;
        pWVar29[iVar20].iParent = idxTerm;
        pWVar29[iVar20].truthProb = pWVar29[idxTerm].truthProb;
        pWVar29[idxTerm].nChild = pWVar29[idxTerm].nChild + '\x01';
      }
    }
  }
LAB_0018868e:
  pWVar29 = pWC->a + idxTerm;
  goto LAB_0018877e;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereInfo *pWInfo = pWC->pWInfo; /* WHERE clause processing context */
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* uppercase equivalent to lowercase */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWInfo->pParse;  /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */
  unsigned char eOp2 = 0;          /* op2 value for LIKE/REGEXP/GLOB */
  int nLeft;                       /* Number of elements on left side vector */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = &pWInfo->sMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = sqlite3WhereExprUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = sqlite3WhereExprListUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = sqlite3WhereExprUsage(pMaskSet, pExpr->pRight);
  }
  pMaskSet->bVarSelect = 0;
  prereqAll = sqlite3WhereExprUsageNN(pMaskSet, pExpr);
  if( pMaskSet->bVarSelect ) pTerm->wtFlags |= TERM_VARSELECT;
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = sqlite3WhereGetMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
    if( (prereqAll>>1)>=x ){
      sqlite3ErrorMsg(pParse, "ON clause references tables to its right");
      return;
    }
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    int aiCurCol[2];
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;

    if( pTerm->iField>0 ){
      assert( op==TK_IN );
      assert( pLeft->op==TK_VECTOR );
      pLeft = pLeft->x.pList->a[pTerm->iField-1].pExpr;
    }

    if( exprMightBeIndexed(pSrc, prereqLeft, aiCurCol, pLeft, op) ){
      pTerm->leftCursor = aiCurCol[0];
      pTerm->u.leftColumn = aiCurCol[1];
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( op==TK_IS ) pTerm->wtFlags |= TERM_IS;
    if( pRight 
     && exprMightBeIndexed(pSrc, pTerm->prereqRight, aiCurCol, pRight, op)
    ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      assert( pTerm->iField==0 );
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        markTermAsChild(pWC, idxNew, idxTerm);
        if( op==TK_IS ) pNew->wtFlags |= TERM_IS;
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;

        if( termIsEquivalence(pParse, pDup) ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pNew->leftCursor = aiCurCol[0];
      pNew->u.leftColumn = aiCurCol[1];
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0));
      transferJoinMarkings(pNewExpr, pExpr);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'aBc%'" is changed into constraints
  **
  **          x>='ABC' AND x<'abd' AND x LIKE 'aBc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".  If case is not significant (the default
  ** for LIKE) then the lower-bound is made all uppercase and the upper-
  ** bound is made all lowercase so that the bounds also work when comparing
  ** BLOBs.
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    const char *zCollSeqName;     /* Name of collating sequence */
    const u16 wtFlags = TERM_LIKEOPT | TERM_VIRTUAL | TERM_DYNAMIC;

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);

    /* Convert the lower bound to upper-case and the upper bound to
    ** lower-case (upper-case is less than lower-case in ASCII) so that
    ** the range constraints also work for BLOBs
    */
    if( noCase && !pParse->db->mallocFailed ){
      int i;
      char c;
      pTerm->wtFlags |= TERM_LIKE;
      for(i=0; (c = pStr1->u.zToken[i])!=0; i++){
        pStr1->u.zToken[i] = sqlite3Toupper(c);
        pStr2->u.zToken[i] = sqlite3Tolower(c);
      }
    }

    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;
        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    zCollSeqName = noCase ? "NOCASE" : sqlite3StrBINARY;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE,
           sqlite3ExprAddCollateString(pParse,pNewExpr1,zCollSeqName),
           pStr1);
    transferJoinMarkings(pNewExpr1, pExpr);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, wtFlags);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateString(pParse,pNewExpr2,zCollSeqName),
           pStr2);
    transferJoinMarkings(pNewExpr2, pExpr);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, wtFlags);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      markTermAsChild(pWC, idxNew1, idxTerm);
      markTermAsChild(pWC, idxNew2, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_AUX auxiliary term to the constraint set if the
  ** current expression is of the form "column OP expr" where OP
  ** is an operator that gets passed into virtual tables but which is
  ** not normally optimized for ordinary tables.  In other words, OP
  ** is one of MATCH, LIKE, GLOB, REGEXP, !=, IS, IS NOT, or NOT NULL.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( pWC->op==TK_AND ){
    Expr *pRight = 0, *pLeft = 0;
    int res = isAuxiliaryVtabOperator(db, pExpr, &eOp2, &pLeft, &pRight);
    while( res-- > 0 ){
      int idxNew;
      WhereTerm *pNewTerm;
      Bitmask prereqColumn, prereqExpr;

      prereqExpr = sqlite3WhereExprUsage(pMaskSet, pRight);
      prereqColumn = sqlite3WhereExprUsage(pMaskSet, pLeft);
      if( (prereqExpr & prereqColumn)==0 ){
        Expr *pNewExpr;
        pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
            0, sqlite3ExprDup(db, pRight, 0));
        if( ExprHasProperty(pExpr, EP_FromJoin) && pNewExpr ){
          ExprSetProperty(pNewExpr, EP_FromJoin);
        }
        idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
        testcase( idxNew==0 );
        pNewTerm = &pWC->a[idxNew];
        pNewTerm->prereqRight = prereqExpr;
        pNewTerm->leftCursor = pLeft->iTable;
        pNewTerm->u.leftColumn = pLeft->iColumn;
        pNewTerm->eOperator = WO_AUX;
        pNewTerm->eMatchOp = eOp2;
        markTermAsChild(pWC, idxNew, idxTerm);
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;
        pNewTerm->prereqAll = pTerm->prereqAll;
      }
      SWAP(Expr*, pLeft, pRight);
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

  /* If there is a vector == or IS term - e.g. "(a, b) == (?, ?)" - create
  ** new terms for each component comparison - "a = ?" and "b = ?".  The
  ** new terms completely replace the original vector comparison, which is
  ** no longer used.
  **
  ** This is only required if at least one side of the comparison operation
  ** is not a sub-select.  */
  if( pWC->op==TK_AND 
  && (pExpr->op==TK_EQ || pExpr->op==TK_IS)
  && (nLeft = sqlite3ExprVectorSize(pExpr->pLeft))>1
  && sqlite3ExprVectorSize(pExpr->pRight)==nLeft
  && ( (pExpr->pLeft->flags & EP_xIsSelect)==0 
    || (pExpr->pRight->flags & EP_xIsSelect)==0)
  ){
    int i;
    for(i=0; i<nLeft; i++){
      int idxNew;
      Expr *pNew;
      Expr *pLeft = sqlite3ExprForVectorField(pParse, pExpr->pLeft, i);
      Expr *pRight = sqlite3ExprForVectorField(pParse, pExpr->pRight, i);

      pNew = sqlite3PExpr(pParse, pExpr->op, pLeft, pRight);
      transferJoinMarkings(pNew, pExpr);
      idxNew = whereClauseInsert(pWC, pNew, TERM_DYNAMIC);
      exprAnalyze(pSrc, pWC, idxNew);
    }
    pTerm = &pWC->a[idxTerm];
    pTerm->wtFlags |= TERM_CODED|TERM_VIRTUAL;  /* Disable the original */
    pTerm->eOperator = 0;
  }

  /* If there is a vector IN term - e.g. "(a, b) IN (SELECT ...)" - create
  ** a virtual term for each vector component. The expression object
  ** used by each such virtual term is pExpr (the full vector IN(...) 
  ** expression). The WhereTerm.iField variable identifies the index within
  ** the vector on the LHS that the virtual term represents.
  **
  ** This only works if the RHS is a simple SELECT, not a compound
  */
  if( pWC->op==TK_AND && pExpr->op==TK_IN && pTerm->iField==0
   && pExpr->pLeft->op==TK_VECTOR
   && pExpr->x.pSelect->pPrior==0
  ){
    int i;
    for(i=0; i<sqlite3ExprVectorSize(pExpr->pLeft); i++){
      int idxNew;
      idxNew = whereClauseInsert(pWC, pExpr, TERM_VIRTUAL);
      pWC->a[idxNew].iField = i+1;
      exprAnalyze(pSrc, pWC, idxNew);
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }

#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
   && !ExprHasProperty(pExpr, EP_FromJoin)
   && OptimizationEnabled(db, SQLITE_Stat34)
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3ExprAlloc(db, TK_NULL, 0, 0));

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      markTermAsChild(pWC, idxNew, idxTerm);
      pTerm = &pWC->a[idxTerm];
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  testcase( pTerm!=&pWC->a[idxTerm] );
  pTerm = &pWC->a[idxTerm];
  pTerm->prereqRight |= extraRight;
}